

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O2

Result __thiscall
wabt::SharedValidator::CheckType
          (SharedValidator *this,Location *loc,Type actual,Type expected,char *desc)

{
  Result RVar1;
  Type expected_local;
  Type actual_local;
  string local_70;
  string local_50;
  
  expected_local = expected;
  actual_local = actual;
  RVar1 = TypeChecker::CheckType(actual,expected);
  if (RVar1.enum_ == Error) {
    Type::GetName_abi_cxx11_(&local_50,&actual_local);
    Type::GetName_abi_cxx11_(&local_70,&expected_local);
    PrintError(this,loc,"type mismatch at %s. got %s, expected %s",desc,local_50._M_dataplus._M_p,
               local_70._M_dataplus._M_p);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
  }
  return (Result)(uint)(RVar1.enum_ == Error);
}

Assistant:

Result SharedValidator::CheckType(const Location& loc,
                                  Type actual,
                                  Type expected,
                                  const char* desc) {
  if (Failed(TypeChecker::CheckType(actual, expected))) {
    PrintError(loc, "type mismatch at %s. got %s, expected %s", desc,
               actual.GetName().c_str(), expected.GetName().c_str());
    return Result::Error;
  }
  return Result::Ok;
}